

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O2

int icu_63::number::impl::PatternStringUtils::escapePaddingString
              (UnicodeString *input,UnicodeString *output,int startIndex,UErrorCode *status)

{
  short sVar1;
  int8_t iVar2;
  short sVar3;
  char16_t srcChar;
  int iVar4;
  int iVar5;
  int iVar6;
  ConstChar16Ptr local_80;
  int local_74;
  ConstChar16Ptr local_70;
  ConstChar16Ptr local_68 [3];
  char16_t *local_50;
  char16_t *local_40;
  
  sVar3 = (input->fUnion).fStackFields.fLengthAndFlags;
  iVar5 = (int)sVar3 >> 5;
  iVar6 = (input->fUnion).fFields.fLength;
  iVar4 = iVar5;
  if (sVar3 < 0) {
    iVar4 = iVar6;
  }
  if (iVar4 == 0) {
    UnicodeString::setTo(input,L" ",-1);
    sVar3 = (input->fUnion).fStackFields.fLengthAndFlags;
    iVar6 = (input->fUnion).fFields.fLength;
    iVar5 = (int)sVar3 >> 5;
  }
  sVar1 = (output->fUnion).fStackFields.fLengthAndFlags;
  local_74 = (output->fUnion).fFields.fLength;
  if (sVar3 < 0) {
    iVar5 = iVar6;
  }
  if (iVar5 == 1) {
    local_68[0].p_ = L"\'";
    iVar2 = UnicodeString::compare(input,local_68,-1);
    local_50 = local_68[0].p_;
    if (iVar2 == '\0') {
      local_70.p_ = L"\'\'";
      UnicodeString::insert(output,startIndex,&local_70,-1);
    }
    else {
      UnicodeString::insert(output,startIndex,input);
    }
  }
  else {
    UnicodeString::insert(output,startIndex,L'\'');
    iVar4 = 0;
    iVar6 = 1;
    while( true ) {
      sVar3 = (input->fUnion).fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar5 = (input->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar3 >> 5;
      }
      if (iVar5 <= iVar4) break;
      srcChar = UnicodeString::doCharAt(input,iVar4);
      if (srcChar == L'\'') {
        local_80.p_ = L"\'\'";
        UnicodeString::insert(output,iVar6 + startIndex,&local_80,-1);
        local_40 = local_80.p_;
        iVar5 = 2;
      }
      else {
        UnicodeString::insert(output,iVar6 + startIndex,srcChar);
        iVar5 = 1;
      }
      iVar6 = iVar6 + iVar5;
      iVar4 = iVar4 + 1;
    }
    UnicodeString::insert(output,iVar6 + startIndex,L'\'');
  }
  iVar6 = (int)sVar1 >> 5;
  if (sVar1 < 0) {
    iVar6 = local_74;
  }
  sVar3 = (output->fUnion).fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    iVar4 = (output->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar3 >> 5;
  }
  return iVar4 - iVar6;
}

Assistant:

int PatternStringUtils::escapePaddingString(UnicodeString input, UnicodeString& output, int startIndex,
                                            UErrorCode& status) {
    (void) status;
    if (input.length() == 0) {
        input.setTo(kFallbackPaddingString, -1);
    }
    int startLength = output.length();
    if (input.length() == 1) {
        if (input.compare(u"'", -1) == 0) {
            output.insert(startIndex, u"''", -1);
        } else {
            output.insert(startIndex, input);
        }
    } else {
        output.insert(startIndex, u'\'');
        int offset = 1;
        for (int i = 0; i < input.length(); i++) {
            // it's okay to deal in chars here because the quote mark is the only interesting thing.
            char16_t ch = input.charAt(i);
            if (ch == u'\'') {
                output.insert(startIndex + offset, u"''", -1);
                offset += 2;
            } else {
                output.insert(startIndex + offset, ch);
                offset += 1;
            }
        }
        output.insert(startIndex + offset, u'\'');
    }
    return output.length() - startLength;
}